

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&),void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&)>
::_call<0,1,2>(cni_helper<void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&),_void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
               *this,vector *args,sequence<0,_1,_2> *param_3)

{
  shared_ptr<cs::context_type> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference val;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  var *in_stack_000000e0;
  var *in_stack_000000f0;
  any *in_stack_ffffffffffffffc8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  __args = try_convert_and_check<const_std::shared_ptr<cs::context_type>_&,_const_std::shared_ptr<cs::context_type>_&,_std::shared_ptr<cs::context_type>,_0UL>
           ::convert(in_stack_000000f0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,1);
  this_00 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
            ::convert(in_stack_000000e0);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,2);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_2UL>::convert(val)
  ;
  std::
  function<void_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
  ::operator()((function<void_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs_impl::any_&)>
                *)this_00,__args,in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}